

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<double>>,qclab::dense::SquareMatrix<std::complex<double>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          SquareMatrix<std::complex<double>_> *lhs,SquareMatrix<std::complex<double>_> *rhs)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  complex<double> *pcVar5;
  complex<double> *pcVar6;
  bool bVar7;
  long lVar8;
  complex<double> *pcVar10;
  complex<double> *pcVar11;
  long lVar12;
  long lVar13;
  AssertionResult AVar14;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var9;
  
  lVar3 = rhs->size_;
  lVar4 = lhs->size_;
  if (lVar3 == lVar4) {
    bVar7 = lVar4 < 1;
    if (lVar4 < 1) {
LAB_00165797:
      if (bVar7) {
        AVar14 = AssertionSuccess();
        _Var9._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )AVar14.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        goto LAB_001657bd;
      }
    }
    else {
      pcVar5 = (rhs->data_)._M_t.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
      pcVar6 = (lhs->data_)._M_t.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
      if ((((*(double *)pcVar5->_M_value == *(double *)pcVar6->_M_value) &&
           (!NAN(*(double *)pcVar5->_M_value) && !NAN(*(double *)pcVar6->_M_value))) &&
          (*(double *)(pcVar5->_M_value + 8) == *(double *)(pcVar6->_M_value + 8))) &&
         (!NAN(*(double *)(pcVar5->_M_value + 8)) && !NAN(*(double *)(pcVar6->_M_value + 8)))) {
        lVar13 = 0;
        bVar7 = false;
        pcVar10 = pcVar6;
        pcVar11 = pcVar5;
        do {
          lVar12 = 0x18;
          lVar8 = 0;
          while( true ) {
            if (lVar4 + -1 == lVar8) goto LAB_00165749;
            lVar8 = lVar8 + 1;
            if ((*(double *)(pcVar11->_M_value + lVar12 + -8) !=
                 *(double *)(pcVar10->_M_value + lVar12 + -8)) ||
               (NAN(*(double *)(pcVar11->_M_value + lVar12 + -8)) ||
                NAN(*(double *)(pcVar10->_M_value + lVar12 + -8)))) break;
            pdVar1 = (double *)(pcVar11->_M_value + lVar12);
            pdVar2 = (double *)(pcVar10->_M_value + lVar12);
            lVar12 = lVar12 + 0x10;
            if ((*pdVar1 != *pdVar2) || (NAN(*pdVar1) || NAN(*pdVar2))) break;
          }
          if (lVar8 < lVar4) goto LAB_00165797;
LAB_00165749:
          lVar13 = lVar13 + 1;
          bVar7 = lVar4 <= lVar13;
          if (lVar13 == lVar4) goto LAB_00165797;
          if ((*(double *)pcVar5[lVar13 * lVar3]._M_value !=
               *(double *)pcVar6[lVar13 * lVar4]._M_value) ||
             (NAN(*(double *)pcVar5[lVar13 * lVar3]._M_value) ||
              NAN(*(double *)pcVar6[lVar13 * lVar4]._M_value))) goto LAB_00165797;
          pcVar11 = pcVar11 + lVar3;
          pcVar10 = pcVar10 + lVar4;
          if ((*(double *)(pcVar5[lVar13 * lVar3]._M_value + 8) !=
               *(double *)(pcVar6[lVar13 * lVar4]._M_value + 8)) ||
             (NAN(*(double *)(pcVar5[lVar13 * lVar3]._M_value + 8)) ||
              NAN(*(double *)(pcVar6[lVar13 * lVar4]._M_value + 8)))) goto LAB_00165797;
        } while( true );
      }
    }
  }
  AVar14 = CmpHelperEQFailure<qclab::dense::SquareMatrix<std::complex<double>>,qclab::dense::SquareMatrix<std::complex<double>>>
                     (this,lhs_expression,rhs_expression,lhs,rhs);
  _Var9._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar14.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
LAB_001657bd:
  AVar14.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var9._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar14._0_8_ = this;
  return AVar14;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression, const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}